

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_bfbs.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  bool bVar1;
  char *pcVar2;
  uint8_t *puVar3;
  size_t size;
  undefined8 uVar4;
  undefined8 uVar5;
  string *in_RCX;
  string *buf;
  bool local_1629;
  undefined1 local_1618 [8];
  string jsongen2;
  string jsongen1;
  undefined1 local_12c8 [8];
  Parser parser2;
  undefined1 local_838 [8];
  Parser parser1;
  char *include_directories [4];
  string local_78 [7];
  bool ok;
  string bfbs_file;
  string json_file;
  string schema_file;
  char **param_1_local;
  int param_0_local;
  
  param_1_local._4_4_ = 0;
  std::__cxx11::string::string((string *)(&json_file.field_2._M_allocated_capacity + 1));
  std::__cxx11::string::string((string *)(bfbs_file.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_78);
  bVar1 = flatbuffers::LoadFile
                    ((flatbuffers *)"tests/monster_test.fbs",(char *)0x0,
                     SUB81((string *)(&json_file.field_2._M_allocated_capacity + 1),0),in_RCX);
  buf = (string *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
  local_1629 = false;
  if (bVar1) {
    bVar1 = flatbuffers::LoadFile
                      ((flatbuffers *)"tests/monsterdata_test.golden",(char *)0x0,
                       (bool)((char)&bfbs_file + '\x18'),buf);
    local_1629 = false;
    if (bVar1) {
      local_1629 = flatbuffers::LoadFile
                             ((flatbuffers *)"tests/monster_test.bfbs",(char *)0x1,SUB81(local_78,0)
                              ,(string *)CONCAT71((int7)((ulong)buf >> 8),bVar1));
    }
  }
  if (local_1629 == false) {
    printf("couldn\'t load files!\n");
    param_1_local._4_4_ = 1;
  }
  else {
    parser1._1912_8_ = anon_var_dwarf_d425b;
    flatbuffers::IDLOptions::IDLOptions((IDLOptions *)&parser2.anonymous_counter_);
    flatbuffers::Parser::Parser((Parser *)local_838,(IDLOptions *)&parser2.anonymous_counter_);
    flatbuffers::IDLOptions::~IDLOptions((IDLOptions *)&parser2.anonymous_counter_);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = flatbuffers::Parser::Parse
                      ((Parser *)local_838,pcVar2,(char **)&parser1.anonymous_counter_,(char *)0x0);
    if (!bVar1) {
      __assert_fail("ok",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_bfbs.cpp"
                    ,0x2d,"int main(int, const char **)");
    }
    flatbuffers::IDLOptions::IDLOptions((IDLOptions *)((long)&jsongen1.field_2 + 8));
    flatbuffers::Parser::Parser((Parser *)local_12c8,(IDLOptions *)((long)&jsongen1.field_2 + 8));
    flatbuffers::IDLOptions::~IDLOptions((IDLOptions *)((long)&jsongen1.field_2 + 8));
    puVar3 = (uint8_t *)std::__cxx11::string::c_str();
    size = std::__cxx11::string::length();
    bVar1 = flatbuffers::Parser::Deserialize((Parser *)local_12c8,puVar3,size);
    if (!bVar1) {
      __assert_fail("ok",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_bfbs.cpp"
                    ,0x33,"int main(int, const char **)");
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = flatbuffers::Parser::Parse
                      ((Parser *)local_838,pcVar2,(char **)&parser1.anonymous_counter_,(char *)0x0);
    if (!bVar1) {
      __assert_fail("ok",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_bfbs.cpp"
                    ,0x37,"int main(int, const char **)");
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = flatbuffers::Parser::Parse
                      ((Parser *)local_12c8,pcVar2,(char **)&parser1.anonymous_counter_,(char *)0x0)
    ;
    if (!bVar1) {
      __assert_fail("ok",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_bfbs.cpp"
                    ,0x39,"int main(int, const char **)");
    }
    std::__cxx11::string::string((string *)(jsongen2.field_2._M_local_buf + 8));
    puVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer
                       ((FlatBufferBuilderImpl<false> *)((long)&parser1.error_.field_2 + 8));
    pcVar2 = flatbuffers::GenText
                       ((Parser *)local_838,puVar3,(string *)((long)&jsongen2.field_2 + 8));
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string((string *)local_1618);
      puVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer
                         ((FlatBufferBuilderImpl<false> *)((long)&parser2.error_.field_2 + 8));
      pcVar2 = flatbuffers::GenText((Parser *)local_12c8,puVar3,(string *)local_1618);
      if (pcVar2 == (char *)0x0) {
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&jsongen2.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1618);
        if (bVar1) {
          uVar4 = std::__cxx11::string::c_str();
          uVar5 = std::__cxx11::string::c_str();
          printf("%s----------------\n%s",uVar4,uVar5);
        }
        printf("The FlatBuffer has been parsed from JSON successfully.\n");
      }
      else {
        printf("Couldn\'t serialize parsed data to JSON!\n");
        param_1_local._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_1618);
    }
    else {
      printf("Couldn\'t serialize parsed data to JSON!\n");
      param_1_local._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)(jsongen2.field_2._M_local_buf + 8));
    flatbuffers::Parser::~Parser((Parser *)local_12c8);
    flatbuffers::Parser::~Parser((Parser *)local_838);
  }
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)(bfbs_file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(json_file.field_2._M_local_buf + 8));
  return param_1_local._4_4_;
}

Assistant:

int main(int /*argc*/, const char * /*argv*/[]) {
  // load FlatBuffer schema (.fbs) and JSON from disk
  std::string schema_file;
  std::string json_file;
  std::string bfbs_file;
  bool ok =
      flatbuffers::LoadFile("tests/monster_test.fbs", false, &schema_file) &&
      flatbuffers::LoadFile("tests/monsterdata_test.golden", false,
                            &json_file) &&
      flatbuffers::LoadFile("tests/monster_test.bfbs", true, &bfbs_file);
  if (!ok) {
    printf("couldn't load files!\n");
    return 1;
  }

  const char *include_directories[] = { "samples", "tests",
                                        "tests/include_test", nullptr };
  // parse fbs schema
  flatbuffers::Parser parser1;
  ok = parser1.Parse(schema_file.c_str(), include_directories);
  assert(ok);

  // inizialize parser by deserializing bfbs schema
  flatbuffers::Parser parser2;
  ok = parser2.Deserialize(reinterpret_cast<const uint8_t *>(bfbs_file.c_str()),
                           bfbs_file.length());
  assert(ok);

  // parse json in parser from fbs and bfbs
  ok = parser1.Parse(json_file.c_str(), include_directories);
  assert(ok);
  ok = parser2.Parse(json_file.c_str(), include_directories);
  assert(ok);

  // to ensure it is correct, we now generate text back from the binary,
  // and compare the two:
  std::string jsongen1;
  if (GenText(parser1, parser1.builder_.GetBufferPointer(), &jsongen1)) {
    printf("Couldn't serialize parsed data to JSON!\n");
    return 1;
  }

  std::string jsongen2;
  if (GenText(parser2, parser2.builder_.GetBufferPointer(), &jsongen2)) {
    printf("Couldn't serialize parsed data to JSON!\n");
    return 1;
  }

  if (jsongen1 != jsongen2) {
    printf("%s----------------\n%s", jsongen1.c_str(), jsongen2.c_str());
  }

  printf("The FlatBuffer has been parsed from JSON successfully.\n");
}